

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall ModbusSimulationDataGenerator::init_crc16_tab(ModbusSimulationDataGenerator *this)

{
  int i;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = 0;
  do {
    iVar2 = 8;
    uVar3 = 0;
    uVar5 = uVar1 & 0xffffffff;
    do {
      uVar4 = uVar3 ^ (uint)uVar5;
      uVar6 = (uVar3 & 0xffff) >> 1;
      uVar3 = uVar6 ^ 0xffffa001;
      if ((uVar4 & 1) == 0) {
        uVar3 = uVar6;
      }
      uVar5 = (ulong)((uint)uVar5 >> 1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    this->crc_tab16[uVar1] = (U16)uVar3;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x100);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::init_crc16_tab( void )
{
    int i, j;
    U16 crc, c;

    for( i = 0; i < 256; i++ )
    {
        crc = 0;
        c = ( U16 )i;

        for( j = 0; j < 8; j++ )
        {
            if( ( crc ^ c ) & 0x0001 )
                crc = ( crc >> 1 ) ^ 0xA001;
            else
                crc = crc >> 1;

            c = c >> 1;
        }

        crc_tab16[ i ] = crc;
    }
}